

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

WORD32 ihevcd_parse_pred_wt_ofst
                 (bitstrm_t *ps_bitstrm,sps_t *ps_sps,pps_t *ps_pps,slice_header_t *ps_slice_hdr)

{
  char cVar1;
  short sVar2;
  WORD16 WVar3;
  UWORD32 UVar4;
  WORD32 WVar5;
  int iVar6;
  long lVar7;
  
  UVar4 = ihevcd_uev(ps_bitstrm);
  (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom = (WORD8)UVar4;
  if (ps_sps->i1_chroma_format_idc != '\0') {
    WVar5 = ihevcd_sev(ps_bitstrm);
    (ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom =
         (char)WVar5 + (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom;
  }
  cVar1 = ps_slice_hdr->i1_num_ref_idx_l0_active;
  if ('\0' < cVar1) {
    lVar7 = 0;
    do {
      UVar4 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_luma_weight_l0_flag[lVar7] = (WORD8)UVar4;
      lVar7 = lVar7 + 1;
      cVar1 = ps_slice_hdr->i1_num_ref_idx_l0_active;
    } while (lVar7 < cVar1);
  }
  if (ps_sps->i1_chroma_format_idc == '\0') {
    if (cVar1 < '\x01') goto LAB_0010fa51;
    memset((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag,0,(long)cVar1);
  }
  else {
    if (cVar1 < '\x01') goto LAB_0010fa51;
    lVar7 = 0;
    do {
      UVar4 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag[lVar7] = (WORD8)UVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 < ps_slice_hdr->i1_num_ref_idx_l0_active);
    if (ps_slice_hdr->i1_num_ref_idx_l0_active < '\x01') goto LAB_0010fa51;
  }
  lVar7 = 0;
  do {
    if ((ps_slice_hdr->s_wt_ofst).i1_luma_weight_l0_flag[lVar7] == '\0') {
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l0[lVar7] =
           (WORD16)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU));
      WVar3 = 0;
    }
    else {
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l0[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      WVar3 = (WORD16)WVar5;
    }
    (ps_slice_hdr->s_wt_ofst).i2_luma_offset_l0[lVar7] = WVar3;
    if ((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag[lVar7] == '\0') {
      WVar3 = (WORD16)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar7] = WVar3;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar7] = WVar3;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cb[lVar7] = 0;
      sVar2 = 0;
    }
    else {
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      iVar6 = WVar5 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar7] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar6 < -0xff) {
        iVar6 = -0x100;
      }
      if (-2 < iVar6) {
        iVar6 = -1;
      }
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cb[lVar7] = (short)iVar6 + 0x80;
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      iVar6 = WVar5 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar7] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar6 < -0xff) {
        iVar6 = -0x100;
      }
      if (-2 < iVar6) {
        iVar6 = -1;
      }
      sVar2 = (short)iVar6 + 0x80;
    }
    (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cr[lVar7] = sVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 < ps_slice_hdr->i1_num_ref_idx_l0_active);
LAB_0010fa51:
  if (ps_slice_hdr->i1_slice_type != '\0') {
    return 0;
  }
  cVar1 = ps_slice_hdr->i1_num_ref_idx_l1_active;
  if ('\0' < cVar1) {
    lVar7 = 0;
    do {
      UVar4 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_luma_weight_l1_flag[lVar7] = (WORD8)UVar4;
      lVar7 = lVar7 + 1;
      cVar1 = ps_slice_hdr->i1_num_ref_idx_l1_active;
    } while (lVar7 < cVar1);
  }
  if (ps_sps->i1_chroma_format_idc == '\0') {
    if (cVar1 < '\x01') {
      return 0;
    }
    memset((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag,0,(long)cVar1);
  }
  else {
    if (cVar1 < '\x01') {
      return 0;
    }
    lVar7 = 0;
    do {
      UVar4 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag[lVar7] = (WORD8)UVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 < ps_slice_hdr->i1_num_ref_idx_l1_active);
    if (ps_slice_hdr->i1_num_ref_idx_l1_active < '\x01') {
      return 0;
    }
  }
  lVar7 = 0;
  do {
    if ((ps_slice_hdr->s_wt_ofst).i1_luma_weight_l1_flag[lVar7] == '\0') {
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l1[lVar7] =
           (WORD16)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU));
      WVar3 = 0;
    }
    else {
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l1[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      WVar3 = (WORD16)WVar5;
    }
    (ps_slice_hdr->s_wt_ofst).i2_luma_offset_l1[lVar7] = WVar3;
    if ((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag[lVar7] == '\0') {
      WVar3 = (WORD16)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar7] = WVar3;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar7] = WVar3;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cb[lVar7] = 0;
      sVar2 = 0;
    }
    else {
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      iVar6 = WVar5 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar7] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar6 < -0xff) {
        iVar6 = -0x100;
      }
      if (-2 < iVar6) {
        iVar6 = -1;
      }
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cb[lVar7] = (short)iVar6 + 0x80;
      WVar5 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar7] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar5;
      WVar5 = ihevcd_sev(ps_bitstrm);
      iVar6 = WVar5 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar7] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar6 < -0xff) {
        iVar6 = -0x100;
      }
      if (-2 < iVar6) {
        iVar6 = -1;
      }
      sVar2 = (short)iVar6 + 0x80;
    }
    (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cr[lVar7] = sVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 < ps_slice_hdr->i1_num_ref_idx_l1_active);
  return 0;
}

Assistant:

WORD32 ihevcd_parse_pred_wt_ofst(bitstrm_t *ps_bitstrm,
                                 sps_t *ps_sps,
                                 pps_t *ps_pps,
                                 slice_header_t *ps_slice_hdr)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    WORD32 i;

    pred_wt_ofst_t *ps_wt_ofst = &ps_slice_hdr->s_wt_ofst;
    UNUSED(ps_pps);

    UEV_PARSE("luma_log2_weight_denom", value, ps_bitstrm);
    ps_wt_ofst->i1_luma_log2_weight_denom = value;

    if(ps_sps->i1_chroma_format_idc != 0)
    {
        SEV_PARSE("delta_chroma_log2_weight_denom", value, ps_bitstrm);
        ps_wt_ofst->i1_chroma_log2_weight_denom = ps_wt_ofst->i1_luma_log2_weight_denom + value;
    }

    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        BITS_PARSE("luma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
        ps_wt_ofst->i1_luma_weight_l0_flag[i] = value;
    }



    if(ps_sps->i1_chroma_format_idc != 0)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            BITS_PARSE("chroma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = value;
        }
    }
    else
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = 0;
        }
    }


    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        if(ps_wt_ofst->i1_luma_weight_l0_flag[i])
        {
            SEV_PARSE("delta_luma_weight_l0[ i ]", value, ps_bitstrm);


            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

            SEV_PARSE("luma_offset_l0[ i ]", value, ps_bitstrm);
            ps_wt_ofst->i2_luma_offset_l0[i] = value;

        }
        else
        {
            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
            ps_wt_ofst->i2_luma_offset_l0[i] = 0;
        }
        if(ps_wt_ofst->i1_chroma_weight_l0_flag[i])
        {
            WORD32 ofst;
            WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = CLIP_S8(ofst);

            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = CLIP_S8(ofst);

        }
        else
        {
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = 0;
            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = 0;
        }
    }
    if(BSLICE == ps_slice_hdr->i1_slice_type)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            BITS_PARSE("luma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_luma_weight_l1_flag[i] = value;
        }

        if(ps_sps->i1_chroma_format_idc != 0)
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                BITS_PARSE("chroma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = value;
            }
        }
        else
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = 0;
            }
        }

        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            if(ps_wt_ofst->i1_luma_weight_l1_flag[i])
            {
                SEV_PARSE("delta_luma_weight_l1[ i ]", value, ps_bitstrm);


                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

                SEV_PARSE("luma_offset_l1[ i ]", value, ps_bitstrm);
                ps_wt_ofst->i2_luma_offset_l1[i] = value;

            }
            else
            {
                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
                ps_wt_ofst->i2_luma_offset_l1[i] = 0;
            }

            if(ps_wt_ofst->i1_chroma_weight_l1_flag[i])
            {
                WORD32 ofst;
                WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = CLIP_S8(ofst);;

                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = CLIP_S8(ofst);;

            }
            else
            {
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = 0;
                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = 0;

            }
        }
    }
    return ret;
}